

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Iterator __thiscall
Map<String,_String>::insert
          (Map<String,_String> *this,Item **cell,Item *parent,String *key,String *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ItemBlock *pIVar7;
  ulong uVar8;
  Item *pIVar9;
  long lVar10;
  Iterator *pIVar11;
  long lVar12;
  Item *unaff_R13;
  Item *this_00;
  
  do {
    if (cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) {
      iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/Map.hpp"
                            ,0x188,"!parent || cell == &parent->left || cell == &parent->right");
      if (iVar6 != 0) goto LAB_0010bc5a;
    }
    this_00 = *cell;
    if (this_00 == (Item *)0x0) {
      this_00 = this->freeItem;
      if (this_00 == (Item *)0x0) {
        pIVar7 = (ItemBlock *)operator_new__(0x228);
        pIVar7->next = this->blocks;
        this->blocks = pIVar7;
        lVar10 = 8;
        lVar12 = 0;
        uVar5 = 0xffffffffffffff80;
        do {
          uVar8 = uVar5;
          *(long *)((long)&pIVar7[0x21].next + uVar8) = lVar12;
          lVar12 = (long)&pIVar7->next + lVar10;
          lVar10 = lVar10 + 0x88;
          uVar5 = uVar8 + 0x88;
        } while (uVar8 + 0x88 < 0x1a0);
        this_00 = (Item *)((long)&pIVar7[0x11].next + uVar8);
        this->freeItem = this_00;
      }
      Item::Item(this_00,parent,key,value);
      this->freeItem = this_00->prev;
      *cell = this_00;
      this->_size = this->_size + 1;
      if (parent == (Item *)0x0) {
        if ((this->_begin).item != &this->endItem) {
          iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/Map.hpp"
                                ,0x1a1,"_begin.item == &endItem");
          if (iVar6 != 0) {
LAB_0010bc5a:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
        }
        this_00->prev = (Item *)0x0;
        this_00->next = (this->_begin).item;
        (this->_begin).item = this_00;
        (this->endItem).prev = this_00;
        bVar4 = true;
        parent = (Item *)0x0;
      }
      else {
        pIVar9 = parent;
        if (cell == &parent->right) {
          pIVar9 = parent->next;
        }
        pIVar1 = pIVar9->prev;
        this_00->prev = pIVar1;
        pIVar11 = &this->_begin;
        if (pIVar1 != (Item *)0x0) {
          pIVar11 = (Iterator *)&pIVar9->prev->next;
        }
        pIVar11->item = this_00;
        this_00->next = pIVar9;
        pIVar9->prev = this_00;
        do {
          uVar2 = parent->height;
          Item::updateHeightAndSlope(parent);
          parent = rebal(this,parent);
          if (uVar2 == parent->height) goto LAB_0010bbd6;
          parent = parent->parent;
        } while (parent != (Item *)0x0);
        parent = (Item *)0x0;
LAB_0010bbd6:
        bVar4 = true;
      }
    }
    else {
      iVar6 = String::compare(key,&this_00->key);
      if (iVar6 < 1) {
        iVar6 = String::compare(key,&this_00->key);
        if (-1 < iVar6) {
          String::operator=(&this_00->value,value);
          goto LAB_0010bbd6;
        }
        cell = &this_00->left;
      }
      else {
        cell = &this_00->right;
      }
      bVar4 = false;
      parent = this_00;
      this_00 = unaff_R13;
    }
    unaff_R13 = this_00;
    if (bVar4) {
      return (Iterator)this_00;
    }
  } while( true );
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }